

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_prismatic_spray(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  CHAR_DATA *in_RCX;
  CHAR_DATA *victim_00;
  long in_RDX;
  bool blinded;
  bool disint;
  bool poisoned;
  int dam;
  int color;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  undefined1 in_stack_00001292;
  undefined1 in_stack_00001293;
  int in_stack_00001294;
  int in_stack_00001298;
  int in_stack_0000129c;
  CHAR_DATA *in_stack_000012a0;
  CHAR_DATA *in_stack_000012a8;
  int in_stack_000012c8;
  int in_stack_000012d0;
  char *in_stack_000012d8;
  CHAR_DATA *in_stack_000036f8;
  CHAR_DATA *in_stack_00003700;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uVar4;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  char *format;
  int dam_type;
  int in_stack_ffffffffffffff60;
  bool local_9b;
  
  dam_type = 1;
  iVar3 = number_range(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  bVar2 = false;
  bVar1 = false;
  local_9b = false;
  act(in_stack_ffffffffffffff30,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
      (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
      (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
  act(in_stack_ffffffffffffff30,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
      (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
      (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
  act(in_stack_ffffffffffffff30,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
      (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
      (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
  victim_00 = (CHAR_DATA *)(ulong)(iVar3 - 1);
  switch(victim_00) {
  case (CHAR_DATA *)0x0:
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    dice(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    saves_spell(in_stack_ffffffffffffff60,victim_00,dam_type);
    break;
  case (CHAR_DATA *)0x1:
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    dice(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    saves_spell(in_stack_ffffffffffffff60,victim_00,dam_type);
    break;
  case (CHAR_DATA *)0x2:
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    dice(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    saves_spell(in_stack_ffffffffffffff60,victim_00,dam_type);
    break;
  case (CHAR_DATA *)0x3:
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    dice(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    saves_spell(in_stack_ffffffffffffff60,victim_00,dam_type);
    bVar2 = saves_spell(in_stack_ffffffffffffff60,victim_00,dam_type);
    bVar2 = !bVar2;
    break;
  case (CHAR_DATA *)0x4:
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    dice(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    saves_spell(in_stack_ffffffffffffff60,victim_00,dam_type);
    LAG_CHAR((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c);
    break;
  case (CHAR_DATA *)0x5:
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    dice(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    saves_spell(in_stack_ffffffffffffff60,victim_00,dam_type);
    local_9b = saves_spell(in_stack_ffffffffffffff60,victim_00,dam_type);
    break;
  case (CHAR_DATA *)0x6:
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    act(in_stack_ffffffffffffff30,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
        (void *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0);
    dice(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    bVar1 = saves_spell(in_stack_ffffffffffffff60,victim_00,dam_type);
    bVar1 = !bVar1;
  }
  uVar4 = 0;
  iVar3 = 0;
  uVar5 = 1;
  format = "prismatic spray";
  damage_new(in_stack_000012a8,in_stack_000012a0,in_stack_0000129c,in_stack_00001298,
             in_stack_00001294,(bool)in_stack_00001293,(bool)in_stack_00001292,in_stack_000012c8,
             in_stack_000012d0,in_stack_000012d8);
  if ((bVar2) && (bVar2 = is_affected(in_RCX,(int)gsn_poison), !bVar2)) {
    act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,uVar5),
        (void *)CONCAT44(in_stack_ffffffffffffff24,iVar3),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,uVar4),0);
    act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,uVar5),
        (void *)CONCAT44(in_stack_ffffffffffffff24,iVar3),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,uVar4),0);
    init_affect((AFFECT_DATA *)0x6e9aef);
    std::pow<int,int>(0,0x6e9b5a);
    affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff24,iVar3),
                   (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff1c,uVar4));
  }
  if (local_9b != false) {
    act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,uVar5),
        (void *)CONCAT44(in_stack_ffffffffffffff24,iVar3),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,uVar4),0);
    act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,uVar5),
        (void *)CONCAT44(in_stack_ffffffffffffff24,iVar3),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,uVar4),0);
    init_affect((AFFECT_DATA *)0x6e9bf0);
    std::pow<int,int>(0,0x6e9c58);
    affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff24,iVar3),
                   (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffff1c,uVar4));
  }
  if (bVar1) {
    act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,uVar5),
        (void *)CONCAT44(in_stack_ffffffffffffff24,iVar3),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,uVar4),0);
    act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,uVar5),
        (void *)CONCAT44(in_stack_ffffffffffffff24,iVar3),
        (void *)CONCAT44(in_stack_ffffffffffffff1c,uVar4),0);
    if ((int)in_RCX->level < *(short *)(in_RDX + 0x138) + -9) {
      act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,uVar5),
          (void *)CONCAT44(in_stack_ffffffffffffff24,iVar3),
          (void *)CONCAT44(in_stack_ffffffffffffff1c,uVar4),0);
      act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,uVar5),
          (void *)CONCAT44(in_stack_ffffffffffffff24,iVar3),
          (void *)CONCAT44(in_stack_ffffffffffffff1c,uVar4),0);
      raw_kill(in_stack_00003700,in_stack_000036f8);
    }
    else {
      dice(iVar3,in_stack_ffffffffffffff1c);
      damage_new(in_stack_000012a8,in_stack_000012a0,in_stack_0000129c,in_stack_00001298,
                 in_stack_00001294,(bool)in_stack_00001293,(bool)in_stack_00001292,in_stack_000012c8
                 ,in_stack_000012d0,in_stack_000012d8);
    }
  }
  return;
}

Assistant:

void spell_prismatic_spray(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;
	int color = number_range(1, 7), dam = 0;
	bool poisoned = false, disint = false, blinded = false;

	act("You send a diffuse spray of varicolored light streaking towards $N!", ch, 0, victim, TO_CHAR);
	act("$n sends a diffuse spray of varicolored light streaking towards you!", ch, 0, victim, TO_VICT);
	act("$n sends a diffuse spray of varicolored light streaking towards $N!", ch, 0, victim, TO_NOTVICT);

	switch (color)
	{
		case 1:
			act("A red beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("A red beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 2);

			if (saves_spell(level, victim, DAM_LIGHT))
				dam /= 2;

			break;
		case 2:
			act("An orange beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("An orange beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 4);

			if (saves_spell(level, victim, DAM_LIGHT))
				dam /= 2;

			break;
		case 3:
			act("A yellow beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("A yellow beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 7);

			if (saves_spell(level, victim, DAM_LIGHT))
				dam /= 2;

			break;
		case 4:
			act("A green beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("A green beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 3);

			if (saves_spell(level, victim, DAM_LIGHT))
				dam /= 2;

			if (!saves_spell(level, victim, DAM_POISON))
				poisoned = true;

			break;
		case 5:
			act("A blue beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("A blue beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 3);

			if (saves_spell(level, victim, DAM_LIGHT))
				dam /= 2;

			LAG_CHAR(victim, 2 * PULSE_VIOLENCE);
			break;
		case 6:
			act("A indigo beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("A indigo beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 3);

			if (saves_spell(level, victim, DAM_LIGHT))
				dam /= 2;

			if (saves_spell(level, victim, DAM_CHARM))
				blinded = true;

			break;
		case 7:
			act("A violet beam of light strikes $n!", victim, 0, 0, TO_ROOM);
			act("A violet beam of light strikes you!", victim, 0, 0, TO_CHAR);

			dam = dice(level, 3);

			if (!saves_spell(level, victim, DAM_INTERNAL))
				disint = true;

			break;
	}

	damage_new(ch, victim, dam, sn, DAM_LIGHT, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "prismatic spray");

	if (poisoned && !is_affected(victim, gsn_poison))
	{
		act("Poison creeps into your veins as the sickly light washes over you.", victim, 0, 0, TO_CHAR);
		act("$n looks very ill.", victim, 0, 0, TO_ROOM);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_poison;
		af.aftype = AFT_MALADY;
		af.owner = ch;
		af.level = level;
		af.location = APPLY_STR;
		af.modifier = -5;
		af.duration = level / 4;

		SET_BIT(af.bitvector, AFF_POISON);

		af.tick_fun = poison_tick;
		af.end_fun = nullptr;
		affect_to_char(victim, &af);
	}

	if (blinded)
	{
		act("The intense indigo light sears your eyes, blinding you!", victim, 0, 0, TO_CHAR);
		act("$n appears to be blinded.", victim, 0, 0, TO_ROOM);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_blindness;
		af.aftype = AFT_SPELL;
		af.owner = ch;
		af.level = level;
		af.location = APPLY_HITROLL;
		af.modifier = -4;
		af.duration = level / 6;

		SET_BIT(af.bitvector, AFF_BLIND);

		af.tick_fun = nullptr;
		af.end_fun = nullptr;
		affect_to_char(victim, &af);
	}

	if (disint)
	{
		act("You feel a piercing pain in your chest as the violet light washes over you!", victim, 0, 0, TO_CHAR);
		act("$n writhes in agony as the violet light passes through $m!", victim, 0, 0, TO_ROOM);

		if (victim->level < ch->level - 9)
		{
			act("You gasp in horror as your body disintegrates into nothingness.", victim, 0, 0, TO_CHAR);
			act("A final look of horror crosses $n's face before $e disintegrates into dust.", victim, 0, 0, TO_ROOM);
			raw_kill(ch, victim);
		}
		else
		{
			damage_new(ch, victim, dice(level, 9), sn, DAM_INTERNAL, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "disintegration");
		}
	}
}